

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZFrontStructMatrix.cpp
# Opt level: O0

void __thiscall
TPZFrontStructMatrix<TPZFrontSym<double>,_double,_TPZStructMatrixOR<double>_>::AssembleNew
          (TPZFrontStructMatrix<TPZFrontSym<double>,_double,_TPZStructMatrixOR<double>_> *this,
          TPZMatrix<double> *stiffness,TPZFMatrix<double> *rhs,
          TPZAutoPointer<TPZGuiInterface> *guiInterface)

{
  TPZCompEl *pTVar1;
  undefined1 uVar2;
  bool bVar3;
  TPZAdmChunkVector<TPZCompEl_*,_10> *rhs_00;
  TPZVec<long> *source;
  TPZGuiInterface *this_00;
  TPZChunkVector<TPZCompEl_*,_10> *this_01;
  int *nelem_00;
  TPZCompEl **ppTVar4;
  TPZFMatrix<double> *in_RCX;
  long *in_RSI;
  long in_RDI;
  TPZCompEl *el;
  TPZVec<int> elorder;
  TPZAdmChunkVector<TPZCompEl_*,_10> *elementvec;
  TPZManVector<long,_10> sourceindex;
  TPZManVector<long,_10> destinationindex;
  TPZElementMatrixT<double> ef;
  TPZElementMatrixT<double> ek;
  int64_t nelem;
  int64_t numel;
  int64_t iel;
  undefined4 in_stack_ffffffffffff77b8;
  int in_stack_ffffffffffff77bc;
  TPZElementMatrixT<double> *in_stack_ffffffffffff77c0;
  int64_t in_stack_ffffffffffff77c8;
  TPZVec<int> *in_stack_ffffffffffff77d0;
  int64_t in_stack_ffffffffffff77d8;
  TPZManVector<long,_10> *in_stack_ffffffffffff77e0;
  TPZCompMesh *in_stack_ffffffffffff77f0;
  undefined7 in_stack_ffffffffffff77f8;
  undefined1 in_stack_ffffffffffff77ff;
  TPZElementMatrixT<double> *in_stack_ffffffffffff7800;
  TPZElementMatrix *in_stack_ffffffffffff7890;
  undefined1 local_86b8 [504];
  TPZFrontStructMatrix<TPZFrontSym<double>,_double,_TPZStructMatrixOR<double>_>
  *in_stack_ffffffffffff7b40;
  TPZElementMatrixT<double> *in_stack_ffffffffffff7be0;
  undefined1 local_4378 [248];
  undefined1 local_4280 [112];
  undefined1 local_4210 [136];
  undefined1 local_4188 [8360];
  undefined1 local_20e0 [8360];
  int64_t local_38;
  long local_30;
  long local_28;
  long *local_10;
  
  local_30 = 0;
  local_10 = in_RSI;
  local_38 = TPZCompMesh::NElements((TPZCompMesh *)0x1db4e0e);
  TPZElementMatrixT<double>::TPZElementMatrixT
            (in_stack_ffffffffffff7800,
             (TPZCompMesh *)CONCAT17(in_stack_ffffffffffff77ff,in_stack_ffffffffffff77f8),
             (MType)((ulong)in_stack_ffffffffffff77f0 >> 0x20));
  TPZElementMatrixT<double>::TPZElementMatrixT
            (in_stack_ffffffffffff7800,
             (TPZCompMesh *)CONCAT17(in_stack_ffffffffffff77ff,in_stack_ffffffffffff77f8),
             (MType)((ulong)in_stack_ffffffffffff77f0 >> 0x20));
  TPZManVector<long,_10>::TPZManVector(in_stack_ffffffffffff77e0,in_stack_ffffffffffff77d8);
  TPZManVector<long,_10>::TPZManVector(in_stack_ffffffffffff77e0,in_stack_ffffffffffff77d8);
  rhs_00 = TPZCompMesh::ElementVec(*(TPZCompMesh **)(in_RDI + 8));
  source = (TPZVec<long> *)TPZCompMesh::NEquations(in_stack_ffffffffffff77f0);
  TPZVec<int>::TPZVec(in_stack_ffffffffffff77d0,in_stack_ffffffffffff77c8,
                      (int *)in_stack_ffffffffffff77c0);
  OrderElement(in_stack_ffffffffffff7b40);
  for (local_28 = 0; local_28 < local_38; local_28 = local_28 + 1) {
    uVar2 = ::TPZAutoPointer::operator_cast_to_bool((TPZAutoPointer *)in_RCX);
    if ((bool)uVar2) {
      this_00 = TPZAutoPointer<TPZGuiInterface>::operator->
                          ((TPZAutoPointer<TPZGuiInterface> *)in_RCX);
      bVar3 = TPZGuiInterface::AmIKilled(this_00);
      if (bVar3) break;
    }
    this_01 = (TPZChunkVector<TPZCompEl_*,_10> *)
              TPZVec<int>::operator[]((TPZVec<int> *)(in_RDI + 0xa8),local_28);
    if (-1 < *(int *)&(this_01->super_TPZSavable)._vptr_TPZSavable) {
      nelem_00 = TPZVec<int>::operator[]((TPZVec<int> *)(in_RDI + 0xa8),local_28);
      ppTVar4 = TPZChunkVector<TPZCompEl_*,_10>::operator[](this_01,(int64_t)nelem_00);
      pTVar1 = *ppTVar4;
      if (pTVar1 != (TPZCompEl *)0x0) {
        (**(code **)(*(long *)pTVar1 + 0x108))(pTVar1,local_4378,local_86b8);
        TPZElementMatrix::ComputeDestinationIndices(in_stack_ffffffffffff7890);
        ::TPZStructMatrix::FilterEquations
                  ((TPZStructMatrix *)in_stack_ffffffffffff77c0,
                   (TPZVec<long> *)CONCAT44(in_stack_ffffffffffff77bc,in_stack_ffffffffffff77b8),
                   (TPZVec<long> *)0x1db50ae);
        if (*(int *)(in_RDI + 200) == 0) {
          if (local_30 % 0x14 == 0) {
            in_stack_ffffffffffff77c0 =
                 (TPZElementMatrixT<double> *)
                 std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
            std::ostream::operator<<(in_stack_ffffffffffff77c0,local_30);
          }
          std::operator<<((ostream *)&std::cout,'*');
          std::ostream::flush();
        }
        local_30 = local_30 + 1;
        in_stack_ffffffffffff77bc = (**(code **)(*(long *)pTVar1 + 0x1f0))();
        if (in_stack_ffffffffffff77bc == 0) {
          (**(code **)(*local_10 + 0x1a0))(local_10,local_4188,local_4210,local_4280);
          TPZFMatrix<double>::AddFel
                    (in_RCX,(TPZFMatrix<double> *)rhs_00,source,
                     (TPZVec<long> *)CONCAT17(uVar2,in_stack_ffffffffffff77f8));
        }
        else {
          TPZElementMatrixT<double>::ApplyConstraints(in_stack_ffffffffffff7be0);
          TPZElementMatrixT<double>::ApplyConstraints(in_stack_ffffffffffff7be0);
          (**(code **)(*local_10 + 0x1a0))(local_10,local_20e0,local_4210,local_4280);
          TPZFMatrix<double>::AddFel
                    (in_RCX,(TPZFMatrix<double> *)rhs_00,source,
                     (TPZVec<long> *)CONCAT17(uVar2,in_stack_ffffffffffff77f8));
        }
      }
    }
  }
  if (*(int *)(in_RDI + 200) == 0) {
    std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
  }
  TPZVec<int>::~TPZVec((TPZVec<int> *)in_stack_ffffffffffff77c0);
  TPZManVector<long,_10>::~TPZManVector((TPZManVector<long,_10> *)in_stack_ffffffffffff77c0);
  TPZManVector<long,_10>::~TPZManVector((TPZManVector<long,_10> *)in_stack_ffffffffffff77c0);
  TPZElementMatrixT<double>::~TPZElementMatrixT(in_stack_ffffffffffff77c0);
  TPZElementMatrixT<double>::~TPZElementMatrixT(in_stack_ffffffffffff77c0);
  return;
}

Assistant:

void TPZFrontStructMatrix<TFront,TVar,TPar>::AssembleNew(TPZMatrix<TVar> & stiffness, TPZFMatrix<TVar> & rhs,TPZAutoPointer<TPZGuiInterface> guiInterface){
	
	int64_t iel;
	int64_t numel = 0, nelem = this->fMesh->NElements();
	TPZElementMatrixT<TVar> ek(this->fMesh,TPZElementMatrix::EK),ef(this->fMesh,TPZElementMatrix::EF);
	TPZManVector<int64_t> destinationindex(0);
	TPZManVector<int64_t> sourceindex(0);
	
	TPZAdmChunkVector<TPZCompEl *> &elementvec = this->fMesh->ElementVec();
	
	
	/**Rearange elements order*/
	TPZVec<int> elorder(this->fMesh->NEquations(),0);
	
	OrderElement();
	
	
	for(iel=0; iel < nelem; iel++) {
		
		if(guiInterface) if(guiInterface->AmIKilled()){
			break;
		}
		
		if(fElementOrder[iel] < 0) continue;
		TPZCompEl *el = elementvec[fElementOrder[iel]];
		if(!el) continue;
		//		int dim = el->NumNodes();
		
		//Builds elements stiffness matrix
		el->CalcStiff(ek,ef);
		ek.ComputeDestinationIndices();
		this->FilterEquations(ek.fSourceIndex,ek.fDestinationIndex);
		//ek.fMat->Print(out);
		//ef.fMat->Print();
		if(!f_quiet)
		{
			if(!(numel%20)) cout << endl << numel;
			//    if(!(numel%20)) cout << endl;
			cout << '*';
			cout.flush();
		}
		numel++;
		
		if(!el->HasDependency()) {
			stiffness.AddKel(ek.fMat,ek.fSourceIndex,ek.fDestinationIndex);
			rhs.AddFel(ef.fMat,ek.fSourceIndex, ek.fDestinationIndex);
		}
		else {
			//ek.Print(*this->fMesh,cout);
			ek.ApplyConstraints();
			ef.ApplyConstraints();
			stiffness.AddKel(ek.fConstrMat,ek.fSourceIndex,ek.fDestinationIndex);
			rhs.AddFel(ef.fConstrMat,ek.fSourceIndex,ek.fDestinationIndex);
			/*
			 if(ek.fConstrMat->Decompose_LU() != -1) {
			 el->ApplyConstraints(ek,ef);
			 ek.Print(*this,check);
			 check.flush();
			 }
			 */
		}
		
	}//fim for iel
	if(!f_quiet)
	{
		cout << endl;
	}
}